

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O1

optional<unsigned_long_long> __thiscall QMetaEnum::keyToValue64(QMetaEnum *this,char *key)

{
  uint uVar1;
  uint uVar2;
  QMetaObject *pQVar3;
  uint *puVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  char cVar8;
  undefined1 *__n;
  undefined1 *__s1;
  int iVar9;
  undefined7 extraout_var;
  undefined4 extraout_var_00;
  _Storage<unsigned_long_long,_true> _Var10;
  QMetaTypeInterface *pQVar11;
  _Storage<unsigned_long_long,_true> _Var12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  long in_FS_OFFSET;
  optional<unsigned_long_long> oVar18;
  QByteArrayView qualifiedKey;
  QByteArrayView scope_00;
  optional<QByteArrayView> scope;
  _Storage<QByteArrayView,_true> local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  _Storage<unsigned_long_long,_true> local_38;
  
  local_38 = (_Storage<unsigned_long_long,_true>)
             ((_Storage<unsigned_long_long,_true> *)(in_FS_OFFSET + 0x28))->_M_value;
  uVar13 = 0;
  _Var10 = local_38;
  if ((key != (char *)0x0) && (this->mobj != (QMetaObject *)0x0)) {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68._M_value.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68._M_value.m_data = &DAT_aaaaaaaaaaaaaaaa;
    lVar15 = -1;
    do {
      lVar5 = lVar15 + 1;
      lVar15 = lVar15 + 1;
    } while (key[lVar5] != '\0');
    qualifiedKey.m_data = key;
    qualifiedKey.m_size = lVar15;
    parse_scope((R_conflict6 *)&local_68._M_value,qualifiedKey);
    __s1 = local_48;
    __n = puStack_50;
    uVar7 = local_68._M_value.m_data;
    uVar6 = local_68._M_value.m_size;
    _Var12 = (_Storage<unsigned_long_long,_true>)(this->data).d;
    uVar16 = *(uint *)(_Var12._M_value + 0xc);
    uVar13 = 0;
    _Var10 = _Var12;
    if (0 < (int)uVar16) {
      cVar8 = (char)local_58;
      pQVar3 = this->mobj;
      iVar14 = uVar16 * -2;
      iVar17 = -1;
      do {
        if (cVar8 == '\0') {
LAB_00286e4b:
          _Var10 = (_Storage<unsigned_long_long,_true>)(pQVar3->d).stringdata;
          puVar4 = (pQVar3->d).data;
          uVar1 = *(uint *)(_Var12._M_value + 0x10);
          if (__n == (undefined1 *)
                     (ulong)*(uint *)(_Var10._M_value +
                                     (long)(int)(puVar4[(int)uVar13 + uVar1] * 2 + 1) * 4)) {
            if (__n != (undefined1 *)0x0) {
              _Var10._M_value._0_4_ =
                   bcmp(__s1,(void *)(*(uint *)(_Var10._M_value +
                                               (long)(int)puVar4[(int)uVar13 + uVar1] * 8) +
                                     _Var10._M_value),(size_t)__n);
              _Var10._M_value._4_4_ = extraout_var_00;
              if (_Var10._M_value._0_4_ != 0) goto LAB_00286eb0;
            }
            if (pQVar3 == (QMetaObject *)0x0) {
              pQVar11 = (QMetaTypeInterface *)0x0;
LAB_00286f34:
              if (pQVar11 == (QMetaTypeInterface *)0x0) {
                iVar9 = -1;
              }
              else {
                iVar9 = ((pQVar11->flags >> 8 & 1) != 0) - 1;
              }
            }
            else {
              iVar9 = 0x40;
              if (((*(uint *)(_Var12._M_value + 8) & 0x40) == 0) &&
                 (iVar9 = 0, (*(uint *)(_Var12._M_value + 8) & 1) == 0)) {
                pQVar11 = (pQVar3->d).metaTypes
                          [(long)(int)puVar4[6] +
                           (ulong)((int)(_Var12._M_value - (long)puVar4 >> 2) - puVar4[9]) / 5];
                goto LAB_00286f34;
              }
            }
            uVar2 = puVar4[uVar1 - iVar17];
            _Var12._M_value._4_4_ = 0;
            _Var12._M_value._0_4_ = uVar2;
            if (iVar9 < 1) {
              _Var10 = (_Storage<unsigned_long_long,_true>)(long)(int)uVar2;
              if (iVar9 == 0) {
                _Var10 = _Var12;
              }
            }
            else {
              _Var10._M_value._4_4_ = puVar4[uVar1 - iVar14];
              _Var10._M_value._0_4_ = uVar2;
            }
            uVar13 = CONCAT71((int7)(uVar13 >> 8),1);
            goto LAB_00286ec4;
          }
        }
        else {
          scope_00.m_data = (storage_type *)uVar7;
          scope_00.m_size = uVar6;
          _Var10._0_1_ = isScopeMatch(scope_00,this);
          _Var10._M_value._1_7_ = extraout_var;
          if (_Var10._0_1_) goto LAB_00286e4b;
        }
LAB_00286eb0:
        iVar14 = iVar14 + -1;
        iVar17 = iVar17 + -2;
        uVar13 = (ulong)((int)uVar13 + 2);
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
      uVar13 = 0;
    }
  }
LAB_00286ec4:
  if (*(uint **)(in_FS_OFFSET + 0x28) == (uint *)local_38._M_value) {
    oVar18.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long_long>._8_8_ = uVar13;
    oVar18.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long_long>._M_payload._M_value = _Var10._M_value;
    return (optional<unsigned_long_long>)
           oVar18.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long_long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<quint64> QMetaEnum::keyToValue64(const char *key) const
{
    if (!mobj || !key)
        return std::nullopt;
    const auto [scope, enumKey] = parse_scope(QLatin1StringView(key));
    for (int i = 0; i < int(data.keyCount()); ++i) {
        if ((!scope || isScopeMatch(*scope, this))
            && enumKey == stringDataView(mobj, mobj->d.data[data.data() + 2 * i])) {
            return value_helper(i);
        }
    }
    return std::nullopt;
}